

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void simple_roaring_bitmap_or_many(void)

{
  roaring_bitmap_t *prVar1;
  roaring_bitmap_t *r;
  uint32_t i;
  uint32_t uVar2;
  roaring_bitmap_t *roaring_bitmaps [2];
  roaring_bitmap_t *local_28;
  roaring_bitmap_t *local_20;
  
  prVar1 = roaring_bitmap_create_with_capacity(0);
  local_28 = prVar1;
  r = roaring_bitmap_create_with_capacity(0);
  uVar2 = 100;
  local_20 = r;
  do {
    roaring_bitmap_add(prVar1,uVar2);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 1000);
  uVar2 = 1000;
  do {
    roaring_bitmap_add(r,uVar2);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 2000);
  prVar1 = roaring_bitmap_or_many(2,&local_28);
  roaring_bitmap_free(local_28);
  roaring_bitmap_free(local_20);
  roaring_bitmap_free(prVar1);
  return;
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}